

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O3

int4 __thiscall
PcodeInjectLibrarySleigh::manualCallFixup
          (PcodeInjectLibrarySleigh *this,string *name,string *snippetstring)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  string sourceName;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"(manual callfixup name=\"",name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_58 = *plVar3;
    lStack_50 = plVar2[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar3;
    local_68 = (long *)*plVar2;
  }
  local_60 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  uVar1 = (**(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary)(this,&local_68,name,1);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->super_PcodeInjectLibrary).injection.
              super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
              super__Vector_impl_data._M_start[(int)uVar1][1].name);
  (*(this->super_PcodeInjectLibrary)._vptr_PcodeInjectLibrary[1])(this,(ulong)uVar1);
  if (local_68 != &local_58) {
    operator_delete(local_68);
  }
  return uVar1;
}

Assistant:

int4 PcodeInjectLibrarySleigh::manualCallFixup(const string &name,const string &snippetstring)

{
  string sourceName = "(manual callfixup name=\"" + name + "\")";
  int4 injectid = allocateInject(sourceName, name, InjectPayload::CALLFIXUP_TYPE);
  InjectPayloadSleigh *payload = (InjectPayloadSleigh *)getPayload(injectid);
  payload->parsestring = snippetstring;
  registerInject(injectid);
  return injectid;
}